

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_wString __thiscall ON_XMLVariant::AsString(ON_XMLVariant *this)

{
  ON_Buffer *this_00;
  ON__UINT64 size;
  void *buffer;
  ON_XMLVariantPrivate *this_01;
  long *in_RSI;
  wchar_t *s;
  ON_wString *src;
  double d;
  int count;
  ON_wString OStack_78;
  double local_70;
  tm local_68;
  
  this_01 = (ON_XMLVariantPrivate *)in_RSI[1];
  switch(this_01->_type) {
  case Bool:
    s = L"false";
    if ((this_01->field_2)._bool_val != false) {
      s = L"true";
    }
    ON_wString::operator=(&this_01->_string_val,s);
    this_01 = (ON_XMLVariantPrivate *)in_RSI[1];
  case String:
    src = &this_01->_string_val;
    goto LAB_0067ba30;
  case Integer:
    d = (double)(this_01->field_2)._int_val;
    goto LAB_0067b9aa;
  case Float:
    d = (double)(this_01->field_2)._float_val;
    goto LAB_0067b9aa;
  case Double:
    d = (this_01->field_2)._double_val;
LAB_0067b9aa:
    src = ON_XMLVariantPrivate::ConvertDoubleToString(this_01,d);
    goto LAB_0067ba30;
  case DoubleArray2:
    count = 2;
    break;
  case DoubleArray3:
    count = 3;
    break;
  case DoubleArray4:
  case DoubleColor4:
    count = 4;
    break;
  case Matrix:
    count = 0x10;
    break;
  case Uuid:
    ON_UuidToString(&(this_01->field_2)._uuid_val,&this_01->_string_val);
    ON_wString::MakeUpperOrdinal((ON_wString *)(in_RSI[1] + 8));
    goto LAB_0067ba25;
  case Time:
    local_70 = (this_01->field_2)._double_val;
    local_68.tm_isdst = 0;
    local_68._36_4_ = 0;
    local_68.tm_gmtoff = 0;
    local_68.tm_mon = 0;
    local_68.tm_year = 0;
    local_68.tm_wday = 0;
    local_68.tm_yday = 0;
    local_68.tm_sec = 0;
    local_68.tm_min = 0;
    local_68.tm_hour = 0;
    local_68.tm_mday = 0;
    local_68.tm_zone = (char *)0x0;
    localtime_r((time_t *)&local_70,&local_68);
    ON_wString::ON_wString(&OStack_78);
    ON_wString::Format(&OStack_78,L"%04u.%02u.%02u_%02u:%02u:%02u",(ulong)(local_68.tm_year + 0x76c)
                       ,(ulong)(local_68.tm_mon + 1),(ulong)local_68._8_8_ >> 0x20,
                       local_68._8_8_ & 0xffffffff,(ulong)local_68._0_8_ >> 0x20,
                       local_68._0_8_ & 0xffffffff);
    ON_wString::operator=((ON_wString *)(in_RSI[1] + 8),&OStack_78);
    ON_wString::~ON_wString(&OStack_78);
    goto LAB_0067ba25;
  case Buffer:
    ON_wString::operator=(&this_01->_string_val,L"base64:");
    this_00 = (ON_Buffer *)(**(code **)(*in_RSI + 0x60))();
    size = ON_Buffer::Size(this_00);
    buffer = operator_new__(size);
    ON_Buffer::Read(this_00,size,buffer);
    ON_Base64::Encode(buffer,size,(ON_wString *)(in_RSI[1] + 8),true);
    operator_delete__(buffer);
LAB_0067ba25:
    src = (ON_wString *)(in_RSI[1] + 8);
    goto LAB_0067ba30;
  default:
    ON_wString::ON_wString((ON_wString *)this,L"");
    return (ON_wString)(wchar_t *)this;
  }
  src = ON_XMLVariantPrivate::ConvertDoubleArrayToString(this_01,count);
LAB_0067ba30:
  ON_wString::ON_wString((ON_wString *)this,src);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLVariant::AsString(void) const
{
  switch (_private->_type)
  {
  case Types::Integer:
    return _private->ConvertDoubleToString(double(_private->_int_val));

  case Types::Float:
    return _private->ConvertDoubleToString(double(_private->_float_val));

  case Types::Double:
    return _private->ConvertDoubleToString(_private->_double_val);

  case Types::DoubleArray3:
    return _private->ConvertDoubleArrayToString(3);

  case Types::DoubleArray4:
  case Types::DoubleColor4:
    return _private->ConvertDoubleArrayToString(4);

  case Types::DoubleArray2:
    return _private->ConvertDoubleArrayToString(2);

  case Types::Matrix:
    return _private->ConvertDoubleArrayToString(16);

  case Types::Bool:
    _private->_string_val = _private->_bool_val ? L"true" : L"false";
    // No break...
  case Types::String:
    return _private->_string_val;

  case Types::Uuid:
    ON_UuidToString(_private->_uuid_val, _private->_string_val);
    _private->_string_val.MakeUpperOrdinal();
    return _private->_string_val;

  case Types::Time:
    _private->_string_val = TimeToString(_private->_time_val);
    return _private->_string_val;

  case Types::Buffer:
    {
      _private->_string_val = wszBase64Prefix;
      auto& buffer = GetBuffer();
      const auto buf_size = buffer.Size();
      auto* buf = new char[size_t(buf_size)];
      buffer.Read(buf_size, buf);
      ON_Base64::Encode(buf, size_t(buf_size), _private->_string_val, true);
      delete[] buf;
      return _private->_string_val;
    }
  
  case Types::Null:
  default:
    break;
  }

  return L"";
}